

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

bool __thiscall
nuraft::raft_server::snapshot_and_compact
          (raft_server *this,ulong committed_idx,bool forced_creation)

{
  undefined8 uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  element_type *peVar9;
  undefined4 extraout_var_00;
  element_type *peVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  ulong uVar14;
  undefined4 extraout_var_03;
  timer_helper *this_00;
  uint64_t uVar15;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  bool bVar16;
  bool val;
  exception *e;
  timer_helper tt;
  handler_type handler;
  ptr<snapshot> new_snapshot;
  ulong log_term_to_compact;
  ptr<log_entry> conf_log;
  ptr<snapshot> local_snp;
  bool f;
  bool snapshot_in_action;
  ulong snapshot_distance;
  ptr<cluster_config> conf;
  ptr<raft_params> params;
  _Placeholder<2> *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  memory_order in_stack_fffffffffffffc84;
  _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>
  *in_stack_fffffffffffffc88;
  timer_helper *in_stack_fffffffffffffc90;
  raft_server *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  atomic<bool> *in_stack_fffffffffffffcd8;
  string local_1f8 [104];
  code *local_190;
  undefined8 local_188;
  undefined1 local_158 [32];
  string local_138 [48];
  undefined8 local_108;
  string local_100 [32];
  string local_e0 [48];
  undefined1 local_b0 [16];
  string local_a0 [32];
  __shared_ptr local_80 [21];
  undefined1 local_6b;
  undefined1 local_6a;
  byte local_69;
  __shared_ptr local_68 [16];
  ulong local_58;
  undefined4 local_50;
  byte local_19;
  ulong local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x205bee);
  context::get_params((context *)in_stack_fffffffffffffc98);
  get_config(in_stack_fffffffffffffc98);
  peVar6 = std::
           __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x205c22);
  uVar7 = cluster_config::get_prev_log_idx(peVar6);
  peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x205c48);
  iVar4 = (*peVar8->_vptr_log_store[2])();
  if (CONCAT44(extraout_var,iVar4) <= uVar7) {
    local_1 = 0;
    local_50 = 1;
    goto LAB_00206bf5;
  }
  peVar9 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x205cca);
  local_58 = (ulong)peVar9->snapshot_distance_;
  peVar9 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x205ce3);
  local_69 = 0;
  bVar16 = false;
  if ((peVar9->enable_randomized_snapshot_creation_ & 1U) != 0) {
    bVar3 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
    bVar16 = false;
    if (!bVar3) {
      get_last_snapshot(in_stack_fffffffffffffc98);
      local_69 = 1;
      bVar3 = std::__shared_ptr::operator_cast_to_bool(local_68);
      bVar16 = false;
      if (!bVar3) {
        peVar9 = std::
                 __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x205d6b);
        bVar16 = peVar9->snapshot_distance_ != 0;
      }
    }
  }
  if ((local_69 & 1) != 0) {
    std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x205da0);
  }
  if (bVar16) {
    local_58 = (ulong)*(uint *)(in_RDI + 0x310);
  }
  if ((local_19 & 1) == 0) {
    peVar9 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x205dde);
    uVar2 = local_18;
    if (peVar9->snapshot_distance_ != 0) {
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x205e08);
      iVar4 = (*peVar8->_vptr_log_store[3])();
      if (local_58 <= (uVar2 - CONCAT44(extraout_var_00,iVar4)) + 1) {
        peVar10 = std::
                  __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x205e6b);
        uVar5 = (*peVar10->_vptr_state_machine[0x13])();
        if ((uVar5 & 1) == 0) {
          local_1 = 0;
          local_50 = 1;
          goto LAB_00206bf5;
        }
        goto LAB_00205eaa;
      }
    }
    local_1 = 0;
    local_50 = 1;
    goto LAB_00206bf5;
  }
LAB_00205eaa:
  local_6a = 0;
  local_6b = 0;
  get_last_snapshot(in_stack_fffffffffffffc98);
  if (((local_19 & 1) == 0) &&
     (bVar16 = std::__shared_ptr::operator_cast_to_bool(local_80), uVar2 = local_18, bVar16)) {
    peVar13 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x205f0b);
    uVar7 = snapshot::get_last_log_idx(peVar13);
    if (local_58 <= uVar2 - uVar7) goto LAB_00205f3e;
LAB_00206a20:
    local_1 = 0;
    local_50 = 1;
  }
  else {
LAB_00205f3e:
    bVar16 = std::atomic<bool>::compare_exchange_strong
                       (in_stack_fffffffffffffcd8,
                        (bool *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0),
                        (memory_order)in_stack_fffffffffffffcc8);
    if (!bVar16) goto LAB_00206a20;
    local_6a = 1;
    bVar16 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar16) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x205fa6);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x205fdf);
        msg_if_given_abi_cxx11_((char *)local_a0,"creating a snapshot for index %lu",local_18);
        (*peVar11->_vptr_logger[8])
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"snapshot_and_compact",0x209,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
    }
    while( true ) {
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2060b1);
      uVar7 = cluster_config::get_log_idx(peVar6);
      bVar16 = false;
      if (local_18 < uVar7) {
        peVar6 = std::
                 __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2060eb);
        uVar7 = cluster_config::get_prev_log_idx(peVar6);
        peVar8 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x206111);
        iVar4 = (*peVar8->_vptr_log_store[3])();
        bVar16 = CONCAT44(extraout_var_01,iVar4) <= uVar7;
      }
      if (!bVar16) break;
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x206168);
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x20617d);
      uVar7 = cluster_config::get_prev_log_idx(peVar6);
      (*peVar8->_vptr_log_store[10])(local_b0,peVar8,uVar7);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2061bf);
      log_entry::get_buf((log_entry *)in_stack_fffffffffffffc90);
      cluster_config::deserialize((buffer *)in_stack_fffffffffffffc98);
      std::shared_ptr<nuraft::cluster_config>::operator=
                ((shared_ptr<nuraft::cluster_config> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffc78);
      std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                ((shared_ptr<nuraft::cluster_config> *)0x20620a);
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x206217);
    }
    peVar6 = std::
             __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x20624f);
    uVar7 = cluster_config::get_log_idx(peVar6);
    if (local_18 < uVar7) {
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x206284);
      uVar7 = cluster_config::get_prev_log_idx(peVar6);
      if (uVar7 == 0) goto LAB_00206484;
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2062b5);
      uVar7 = cluster_config::get_prev_log_idx(peVar6);
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2062db);
      iVar4 = (*peVar8->_vptr_log_store[3])();
      if (CONCAT44(extraout_var_02,iVar4) <= uVar7) goto LAB_00206484;
      bVar16 = std::__shared_ptr::operator_cast_to_bool(local_80);
      if (!bVar16) {
        bVar16 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar16) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x206350);
          iVar4 = (*peVar11->_vptr_logger[7])();
          if (1 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x206389);
            msg_if_given_abi_cxx11_
                      ((char *)local_e0,
                       "No snapshot could be found while no configuration cannot be found in current committed logs, this is a system error, exiting"
                      );
            (*peVar11->_vptr_logger[8])
                      (peVar11,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x219,local_e0);
            std::__cxx11::string::~string(local_e0);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x206426);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x20642e);
        (*peVar12->_vptr_state_mgr[8])(peVar12,0xfffffffa);
        exit(-1);
      }
      peVar13 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x206458);
      snapshot::get_last_config(peVar13);
      std::shared_ptr<nuraft::cluster_config>::operator=
                ((shared_ptr<nuraft::cluster_config> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffc78);
    }
    else {
LAB_00206484:
      peVar6 = std::
               __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x206491);
      uVar7 = cluster_config::get_log_idx(peVar6);
      if (local_18 < uVar7) {
        peVar6 = std::
                 __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2064c6);
        uVar7 = cluster_config::get_prev_log_idx(peVar6);
        if ((uVar7 == 0) &&
           (bVar16 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318)),
           bVar16)) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x20651b);
          iVar4 = (*peVar11->_vptr_logger[7])();
          if (2 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x206554);
            peVar6 = std::
                     __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x206566);
            uVar7 = cluster_config::get_log_idx(peVar6);
            peVar6 = std::
                     __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x206582);
            uVar14 = cluster_config::get_prev_log_idx(peVar6);
            msg_if_given_abi_cxx11_
                      ((char *)local_100,
                       "config at log idx 1 is not availabe, config log idx %lu, prev log idx %lu, committed idx %lu"
                       ,uVar7,uVar14,local_18);
            (*peVar11->_vptr_logger[8])
                      (peVar11,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x22a,local_100);
            std::__cxx11::string::~string(local_100);
          }
        }
      }
    }
    peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x206639);
    iVar4 = (*peVar8->_vptr_log_store[0xb])(peVar8,local_18);
    local_108 = CONCAT44(extraout_var_03,iVar4);
    cs_new<nuraft::snapshot,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&>
              (&in_stack_fffffffffffffc88->_M_f,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffc78);
    bVar16 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar16) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2066b9);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2066ec);
        msg_if_given_abi_cxx11_
                  ((char *)local_138,"create snapshot idx %lu log_term %lu",local_18,local_108);
        (*peVar11->_vptr_logger[8])
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"snapshot_and_compact",0x234,local_138);
        std::__cxx11::string::~string(local_138);
      }
    }
    local_190 = on_snapshot_completed;
    local_188 = 0;
    std::
    bind<void(nuraft::raft_server::*)(std::shared_ptr<nuraft::snapshot>&,bool,std::shared_ptr<std::exception>&),nuraft::raft_server*,std::shared_ptr<nuraft::snapshot>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((offset_in_raft_server_to_subr *)in_stack_fffffffffffffc98,
               (raft_server **)in_stack_fffffffffffffc90,
               (shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffc88,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    std::function<void(bool&,std::shared_ptr<std::exception>&)>::
    function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::snapshot>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>&,bool,std::shared_ptr<std::exception>&)>,void>
              ((function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *)
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::
    _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>
    ::~_Bind((_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>
              *)0x20681c);
    timer_helper::timer_helper
              (in_stack_fffffffffffffc90,(size_t)in_stack_fffffffffffffc88,
               SUB41(in_stack_fffffffffffffc84 >> 0x18,0));
    this_00 = (timer_helper *)
              std::
              __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x206843);
    peVar13 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    (*((_func_int **)(this_00->t_created_).__d.__r)[0x12])(this_00,peVar13,local_158);
    bVar16 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar16) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2068a4);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2068d7);
        uVar1 = local_108;
        uVar15 = timer_helper::get_us(this_00);
        msg_if_given_abi_cxx11_
                  ((char *)local_1f8,"create snapshot idx %lu log_term %lu done: %lu us elapsed",
                   local_18,uVar1,uVar15);
        (*peVar11->_vptr_logger[8])
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"snapshot_and_compact",0x240,local_1f8);
        std::__cxx11::string::~string(local_1f8);
      }
    }
    local_6a = 0;
    local_1 = 1;
    local_50 = 1;
    std::function<void_(bool_&,_std::shared_ptr<std::exception>_&)>::~function
              ((function<void_(bool_&,_std::shared_ptr<std::exception>_&)> *)0x2069f5);
    std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x206a02);
  }
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x206a40);
LAB_00206bf5:
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x206c02);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x206c0f);
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::snapshot_and_compact(ulong committed_idx, bool forced_creation) {
    ptr<raft_params> params = ctx_->get_params();

    // get the latest configuration info
    ptr<cluster_config> conf = get_config();
    if ( conf->get_prev_log_idx() >= log_store_->next_slot() ) {
        // The latest config and previous config is not in log_store,
        // so skip the snapshot creation.
        return false;
    }

    auto snapshot_distance = (ulong)params->snapshot_distance_;
    // Randomized snapshot distance for the first creation.
    if ( params->enable_randomized_snapshot_creation_ &&
         !snp_in_progress_.load(std::memory_order_relaxed) &&
         !get_last_snapshot() &&
         params->snapshot_distance_ != 0 ) {
        snapshot_distance = first_snapshot_distance_;
    }

    if (!forced_creation) {
        // If `forced_creation == true`, ignore below conditions.
        if ( params->snapshot_distance_ == 0 ||
             ( committed_idx - log_store_->start_index() + 1 ) < snapshot_distance ) {
            // snapshot is disabled or the log store is not long enough
            return false;
        }

        if ( !state_machine_->chk_create_snapshot() ) {
            // User-defined state machine doesn't want to create a snapshot.
            return false;
        }
    }

    bool snapshot_in_action = false;
 try {
    bool f = false;
    ptr<snapshot> local_snp = get_last_snapshot();
    if ( ( forced_creation ||
           !local_snp ||
           ( committed_idx - local_snp->get_last_log_idx() ) >= snapshot_distance ) &&
         snp_in_progress_.compare_exchange_strong(f, true) )
    {
        snapshot_in_action = true;
        p_in("creating a snapshot for index %" PRIu64 "", committed_idx);

        while ( conf->get_log_idx() > committed_idx &&
                conf->get_prev_log_idx() >= log_store_->start_index() ) {
            ptr<log_entry> conf_log
                ( log_store_->entry_at( conf->get_prev_log_idx() ) );
            conf = cluster_config::deserialize(conf_log->get_buf());
        }

        if ( conf->get_log_idx() > committed_idx &&
             conf->get_prev_log_idx() > 0 &&
             conf->get_prev_log_idx() < log_store_->start_index() ) {
            if (!local_snp) {
                // LCOV_EXCL_START
                p_er("No snapshot could be found while no configuration "
                     "cannot be found in current committed logs, "
                     "this is a system error, exiting");
                ctx_->state_mgr_->system_exit(raft_err::N6_no_snapshot_found);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }
            conf = local_snp->get_last_config();

        } else if ( conf->get_log_idx() > committed_idx &&
                    conf->get_prev_log_idx() == 0 ) {
            // Modified by Jung-Sang Ahn in May, 2018:
            //  Since we remove configure from state machine
            //  (necessary when we clone a node to another node),
            //  config at log idx 1 may not be visiable in some condition.
            p_wn("config at log idx 1 is not availabe, "
                 "config log idx %" PRIu64 ", prev log idx %" PRIu64
                 ", committed idx %" PRIu64,
                 conf->get_log_idx(), conf->get_prev_log_idx(), committed_idx);
            //ctx_->state_mgr_->system_exit(raft_err::N7_no_config_at_idx_one);
            //::exit(-1);
            //return;
        }

        ulong log_term_to_compact = log_store_->term_at(committed_idx);
        ptr<snapshot> new_snapshot
            ( cs_new<snapshot>(committed_idx, log_term_to_compact, conf) );
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64,
              committed_idx, log_term_to_compact );
        cmd_result<bool>::handler_type handler =
            (cmd_result<bool>::handler_type)
            std::bind( &raft_server::on_snapshot_completed,
                       this,
                       new_snapshot,
                       std::placeholders::_1,
                       std::placeholders::_2 );
        timer_helper tt;
        state_machine_->create_snapshot(*new_snapshot, handler);
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64
              " done: %" PRIu64 " us elapsed",
              committed_idx, log_term_to_compact, tt.get_us() );

        snapshot_in_action = false;
        return true;
    }
    return false;

 } catch (std::exception &e) {
    p_er( "failed to compact logs at index %" PRIu64 " due to errors %s",
          committed_idx, e.what());
    if (snapshot_in_action) {
        bool val = true;
        snp_in_progress_.compare_exchange_strong(val, false);
    }
    return false;
 }
}